

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  ulong uVar5;
  Scene *pSVar6;
  float **ppfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  Geometry *pGVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong *puVar73;
  undefined1 (*pauVar74) [16];
  uint uVar75;
  uint uVar76;
  ulong uVar77;
  long lVar78;
  ulong uVar79;
  long lVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  float fVar85;
  float fVar92;
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar90;
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar89 [64];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar107;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar106;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar112;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar130;
  float fVar131;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar122 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar121 [16];
  undefined1 auVar125 [32];
  float fVar132;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float fVar140;
  float fVar141;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar203;
  float fVar204;
  float fVar208;
  float fVar209;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar216;
  float fVar218;
  undefined1 auVar217 [64];
  float fVar219;
  float fVar220;
  undefined1 auVar221 [32];
  float fVar225;
  float fVar227;
  float fVar229;
  float fVar231;
  float fVar233;
  float fVar235;
  undefined1 auVar222 [32];
  float fVar224;
  float fVar226;
  float fVar228;
  float fVar230;
  float fVar232;
  float fVar234;
  undefined1 auVar223 [64];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  float fVar240;
  undefined1 auVar241 [32];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar242 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2958) [16];
  int local_2924;
  undefined8 local_2920;
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  float fStack_2904;
  long local_2900;
  long local_28f8;
  RTCFilterFunctionNArguments local_28f0;
  undefined1 local_28c0 [32];
  undefined8 local_28a0;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  float local_2870;
  float local_286c;
  float local_2868;
  undefined4 local_2864;
  undefined4 local_2860;
  undefined4 local_285c;
  uint local_2858;
  uint local_2854;
  uint local_2850;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [32];
  float local_27a0;
  float fStack_279c;
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  float local_2660 [4];
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  undefined4 uStack_2644;
  float local_2640 [4];
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  undefined4 uStack_2624;
  undefined1 local_2620 [32];
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2958 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar122 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    auVar108 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar86._8_4_ = 0x7fffffff;
    auVar86._0_8_ = 0x7fffffff7fffffff;
    auVar86._12_4_ = 0x7fffffff;
    auVar86 = vandps_avx((undefined1  [16])aVar4,auVar86);
    auVar142._8_4_ = 0x219392ef;
    auVar142._0_8_ = 0x219392ef219392ef;
    auVar142._12_4_ = 0x219392ef;
    auVar86 = vcmpps_avx(auVar86,auVar142,1);
    auVar86 = vblendvps_avx((undefined1  [16])aVar4,auVar142,auVar86);
    auVar142 = vrcpps_avx(auVar86);
    fVar140 = auVar142._0_4_;
    auVar117._0_4_ = auVar86._0_4_ * fVar140;
    fVar27 = auVar142._4_4_;
    auVar117._4_4_ = auVar86._4_4_ * fVar27;
    fVar28 = auVar142._8_4_;
    auVar117._8_4_ = auVar86._8_4_ * fVar28;
    fVar29 = auVar142._12_4_;
    auVar117._12_4_ = auVar86._12_4_ * fVar29;
    auVar143._8_4_ = 0x3f800000;
    auVar143._0_8_ = 0x3f8000003f800000;
    auVar143._12_4_ = 0x3f800000;
    auVar86 = vsubps_avx(auVar143,auVar117);
    uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2540._4_4_ = uVar3;
    local_2540._0_4_ = uVar3;
    local_2540._8_4_ = uVar3;
    local_2540._12_4_ = uVar3;
    local_2540._16_4_ = uVar3;
    local_2540._20_4_ = uVar3;
    local_2540._24_4_ = uVar3;
    local_2540._28_4_ = uVar3;
    auVar215 = ZEXT3264(local_2540);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2560._4_4_ = uVar3;
    local_2560._0_4_ = uVar3;
    local_2560._8_4_ = uVar3;
    local_2560._12_4_ = uVar3;
    local_2560._16_4_ = uVar3;
    local_2560._20_4_ = uVar3;
    local_2560._24_4_ = uVar3;
    local_2560._28_4_ = uVar3;
    auVar217 = ZEXT3264(local_2560);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2580._4_4_ = uVar3;
    local_2580._0_4_ = uVar3;
    local_2580._8_4_ = uVar3;
    local_2580._12_4_ = uVar3;
    local_2580._16_4_ = uVar3;
    local_2580._20_4_ = uVar3;
    local_2580._24_4_ = uVar3;
    local_2580._28_4_ = uVar3;
    auVar223 = ZEXT3264(local_2580);
    auVar118._0_4_ = fVar140 + fVar140 * auVar86._0_4_;
    auVar118._4_4_ = fVar27 + fVar27 * auVar86._4_4_;
    auVar118._8_4_ = fVar28 + fVar28 * auVar86._8_4_;
    auVar118._12_4_ = fVar29 + fVar29 * auVar86._12_4_;
    auVar86 = vshufps_avx(auVar118,auVar118,0);
    local_25a0._16_16_ = auVar86;
    local_25a0._0_16_ = auVar86;
    auVar237 = ZEXT3264(local_25a0);
    auVar86 = vmovshdup_avx(auVar118);
    auVar142 = vshufps_avx(auVar118,auVar118,0x55);
    local_25c0._16_16_ = auVar142;
    local_25c0._0_16_ = auVar142;
    auVar239 = ZEXT3264(local_25c0);
    auVar142 = vshufpd_avx(auVar118,auVar118,1);
    auVar117 = vshufps_avx(auVar118,auVar118,0xaa);
    local_25e0._16_16_ = auVar117;
    local_25e0._0_16_ = auVar117;
    auVar242 = ZEXT3264(local_25e0);
    uVar81 = (ulong)(auVar118._0_4_ < 0.0) * 8;
    uVar71 = (ulong)(auVar86._0_4_ < 0.0);
    lVar1 = uVar71 * 8;
    uVar72 = (ulong)(auVar142._0_4_ < 0.0);
    lVar2 = uVar72 * 8;
    auVar86 = vshufps_avx(auVar122,auVar122,0);
    local_23e0._16_16_ = auVar86;
    local_23e0._0_16_ = auVar86;
    auVar86 = vshufps_avx(auVar108,auVar108,0);
    auVar89 = ZEXT3264(CONCAT1616(auVar86,auVar86));
    uVar82 = uVar81 ^ 8;
    uVar84 = lVar1 + 0x10U ^ 8;
    uVar79 = lVar2 + 0x20U ^ 8;
    local_2600 = mm_lookupmask_ps._0_8_;
    uStack_25f8 = mm_lookupmask_ps._8_8_;
    uStack_25f0 = mm_lookupmask_ps._240_8_;
    uStack_25e8 = mm_lookupmask_ps._248_8_;
LAB_00e76789:
    if (local_2958 != (undefined1 (*) [16])&local_23a0) {
      pauVar74 = local_2958 + -1;
      local_2958 = local_2958 + -1;
      if (*(float *)(*pauVar74 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar77 = *(ulong *)*local_2958;
        while ((uVar77 & 8) == 0) {
          uVar83 = uVar77 & 0xfffffffffffffff0;
          puVar73 = (ulong *)(uVar83 + 0x40);
          if (uVar83 == 0) {
            puVar73 = (ulong *)0x0;
          }
          auVar122._8_8_ = 0;
          auVar122._0_8_ = *puVar73;
          auVar119._8_8_ = 0;
          auVar119._0_8_ = puVar73[1];
          auVar86 = vpminub_avx(auVar122,auVar119);
          auVar86 = vpcmpeqb_avx(auVar122,auVar86);
          auVar108._8_8_ = 0;
          auVar108._0_8_ = *(ulong *)((long)puVar73 + 4);
          auVar136._8_8_ = 0;
          auVar136._0_8_ = *(ulong *)((long)puVar73 + 0xc);
          auVar122 = vpminub_avx(auVar108,auVar136);
          auVar122 = vpcmpeqb_avx(auVar108,auVar122);
          fVar140 = *(float *)(puVar73 + 6);
          fVar27 = *(float *)((long)puVar73 + 0x3c);
          auVar120._8_8_ = 0;
          auVar120._0_8_ = puVar73[auVar118._0_4_ < 0.0];
          auVar108 = vpmovzxbd_avx(auVar120);
          auVar162._8_8_ = 0;
          auVar162._0_8_ = *(ulong *)((long)puVar73 + uVar81 + 4);
          auVar142 = vpmovzxbd_avx(auVar162);
          auVar123._16_16_ = auVar142;
          auVar123._0_16_ = auVar108;
          auVar123 = vcvtdq2ps_avx(auVar123);
          auVar124._0_4_ = fVar140 + fVar27 * auVar123._0_4_;
          auVar124._4_4_ = fVar140 + fVar27 * auVar123._4_4_;
          auVar124._8_4_ = fVar140 + fVar27 * auVar123._8_4_;
          auVar124._12_4_ = fVar140 + fVar27 * auVar123._12_4_;
          auVar124._16_4_ = fVar140 + fVar27 * auVar123._16_4_;
          auVar124._20_4_ = fVar140 + fVar27 * auVar123._20_4_;
          auVar124._24_4_ = fVar140 + fVar27 * auVar123._24_4_;
          auVar124._28_4_ = fVar140 + auVar123._28_4_;
          auVar163._8_8_ = 0;
          auVar163._0_8_ = *(ulong *)((long)puVar73 + uVar82);
          auVar108 = vpmovzxbd_avx(auVar163);
          auVar168._8_8_ = 0;
          auVar168._0_8_ = *(ulong *)((long)puVar73 + uVar82 + 4);
          auVar142 = vpmovzxbd_avx(auVar168);
          auVar164._16_16_ = auVar142;
          auVar164._0_16_ = auVar108;
          auVar123 = vcvtdq2ps_avx(auVar164);
          auVar137._0_4_ = fVar140 + fVar27 * auVar123._0_4_;
          auVar137._4_4_ = fVar140 + fVar27 * auVar123._4_4_;
          auVar137._8_4_ = fVar140 + fVar27 * auVar123._8_4_;
          auVar137._12_4_ = fVar140 + fVar27 * auVar123._12_4_;
          auVar137._16_4_ = fVar140 + fVar27 * auVar123._16_4_;
          auVar137._20_4_ = fVar140 + fVar27 * auVar123._20_4_;
          auVar137._24_4_ = fVar140 + fVar27 * auVar123._24_4_;
          auVar137._28_4_ = fVar140 + fVar27;
          fVar140 = *(float *)((long)puVar73 + 0x34);
          fVar27 = *(float *)(puVar73 + 8);
          auVar144._8_8_ = 0;
          auVar144._0_8_ = puVar73[uVar71 + 2];
          auVar108 = vpmovzxbd_avx(auVar144);
          auVar177._8_8_ = 0;
          auVar177._0_8_ = *(ulong *)((long)puVar73 + lVar1 + 0x14);
          auVar142 = vpmovzxbd_avx(auVar177);
          auVar146._16_16_ = auVar142;
          auVar146._0_16_ = auVar108;
          auVar123 = vcvtdq2ps_avx(auVar146);
          auVar147._0_4_ = fVar140 + fVar27 * auVar123._0_4_;
          auVar147._4_4_ = fVar140 + fVar27 * auVar123._4_4_;
          auVar147._8_4_ = fVar140 + fVar27 * auVar123._8_4_;
          auVar147._12_4_ = fVar140 + fVar27 * auVar123._12_4_;
          auVar147._16_4_ = fVar140 + fVar27 * auVar123._16_4_;
          auVar147._20_4_ = fVar140 + fVar27 * auVar123._20_4_;
          auVar147._24_4_ = fVar140 + fVar27 * auVar123._24_4_;
          auVar147._28_4_ = fVar140 + auVar123._28_4_;
          auVar178._8_8_ = 0;
          auVar178._0_8_ = *(ulong *)((long)puVar73 + uVar84);
          auVar108 = vpmovzxbd_avx(auVar178);
          auVar205._8_8_ = 0;
          auVar205._0_8_ = *(ulong *)((long)puVar73 + uVar84 + 4);
          auVar142 = vpmovzxbd_avx(auVar205);
          auVar181._16_16_ = auVar142;
          auVar181._0_16_ = auVar108;
          auVar123 = vcvtdq2ps_avx(auVar181);
          auVar165._0_4_ = fVar140 + auVar123._0_4_ * fVar27;
          auVar165._4_4_ = fVar140 + auVar123._4_4_ * fVar27;
          auVar165._8_4_ = fVar140 + auVar123._8_4_ * fVar27;
          auVar165._12_4_ = fVar140 + auVar123._12_4_ * fVar27;
          auVar165._16_4_ = fVar140 + auVar123._16_4_ * fVar27;
          auVar165._20_4_ = fVar140 + auVar123._20_4_ * fVar27;
          auVar165._24_4_ = fVar140 + auVar123._24_4_ * fVar27;
          auVar165._28_4_ = fVar140 + fVar27;
          auVar169._8_8_ = 0;
          auVar169._0_8_ = puVar73[uVar72 + 4];
          auVar108 = vpmovzxbd_avx(auVar169);
          auVar179._8_8_ = 0;
          auVar179._0_8_ = *(ulong *)((long)puVar73 + lVar2 + 0x24);
          auVar142 = vpmovzxbd_avx(auVar179);
          auVar170._16_16_ = auVar142;
          auVar170._0_16_ = auVar108;
          auVar180._8_8_ = 0;
          auVar180._0_8_ = *(ulong *)((long)puVar73 + uVar79);
          auVar108 = vpmovzxbd_avx(auVar180);
          auVar206._8_8_ = 0;
          auVar206._0_8_ = *(ulong *)((long)puVar73 + uVar79 + 4);
          auVar142 = vpmovzxbd_avx(auVar206);
          auVar182._16_16_ = auVar142;
          auVar182._0_16_ = auVar108;
          fVar140 = *(float *)((long)puVar73 + 0x44);
          auVar123 = vcvtdq2ps_avx(auVar170);
          auVar26 = vcvtdq2ps_avx(auVar182);
          fVar27 = *(float *)(puVar73 + 7);
          auVar171._0_4_ = fVar27 + fVar140 * auVar123._0_4_;
          auVar171._4_4_ = fVar27 + fVar140 * auVar123._4_4_;
          auVar171._8_4_ = fVar27 + fVar140 * auVar123._8_4_;
          auVar171._12_4_ = fVar27 + fVar140 * auVar123._12_4_;
          auVar171._16_4_ = fVar27 + fVar140 * auVar123._16_4_;
          auVar171._20_4_ = fVar27 + fVar140 * auVar123._20_4_;
          auVar171._24_4_ = fVar27 + fVar140 * auVar123._24_4_;
          auVar171._28_4_ = fVar27 + auVar123._28_4_;
          auVar183._0_4_ = fVar27 + fVar140 * auVar26._0_4_;
          auVar183._4_4_ = fVar27 + fVar140 * auVar26._4_4_;
          auVar183._8_4_ = fVar27 + fVar140 * auVar26._8_4_;
          auVar183._12_4_ = fVar27 + fVar140 * auVar26._12_4_;
          auVar183._16_4_ = fVar27 + fVar140 * auVar26._16_4_;
          auVar183._20_4_ = fVar27 + fVar140 * auVar26._20_4_;
          auVar183._24_4_ = fVar27 + fVar140 * auVar26._24_4_;
          auVar183._28_4_ = fVar27 + auVar26._28_4_;
          auVar123 = vsubps_avx(auVar124,auVar215._0_32_);
          auVar26._4_4_ = auVar237._4_4_ * auVar123._4_4_;
          auVar26._0_4_ = auVar237._0_4_ * auVar123._0_4_;
          auVar26._8_4_ = auVar237._8_4_ * auVar123._8_4_;
          auVar26._12_4_ = auVar237._12_4_ * auVar123._12_4_;
          auVar26._16_4_ = auVar237._16_4_ * auVar123._16_4_;
          auVar26._20_4_ = auVar237._20_4_ * auVar123._20_4_;
          auVar26._24_4_ = auVar237._24_4_ * auVar123._24_4_;
          auVar26._28_4_ = auVar123._28_4_;
          auVar123 = vsubps_avx(auVar147,auVar217._0_32_);
          auVar30._4_4_ = auVar239._4_4_ * auVar123._4_4_;
          auVar30._0_4_ = auVar239._0_4_ * auVar123._0_4_;
          auVar30._8_4_ = auVar239._8_4_ * auVar123._8_4_;
          auVar30._12_4_ = auVar239._12_4_ * auVar123._12_4_;
          auVar30._16_4_ = auVar239._16_4_ * auVar123._16_4_;
          auVar30._20_4_ = auVar239._20_4_ * auVar123._20_4_;
          auVar30._24_4_ = auVar239._24_4_ * auVar123._24_4_;
          auVar30._28_4_ = auVar123._28_4_;
          auVar123 = vmaxps_avx(auVar26,auVar30);
          auVar26 = vsubps_avx(auVar171,auVar223._0_32_);
          auVar31._4_4_ = auVar242._4_4_ * auVar26._4_4_;
          auVar31._0_4_ = auVar242._0_4_ * auVar26._0_4_;
          auVar31._8_4_ = auVar242._8_4_ * auVar26._8_4_;
          auVar31._12_4_ = auVar242._12_4_ * auVar26._12_4_;
          auVar31._16_4_ = auVar242._16_4_ * auVar26._16_4_;
          auVar31._20_4_ = auVar242._20_4_ * auVar26._20_4_;
          auVar31._24_4_ = auVar242._24_4_ * auVar26._24_4_;
          auVar31._28_4_ = auVar26._28_4_;
          auVar26 = vmaxps_avx(auVar31,local_23e0);
          local_27c0 = vmaxps_avx(auVar123,auVar26);
          auVar123 = vsubps_avx(auVar137,auVar215._0_32_);
          auVar32._4_4_ = auVar237._4_4_ * auVar123._4_4_;
          auVar32._0_4_ = auVar237._0_4_ * auVar123._0_4_;
          auVar32._8_4_ = auVar237._8_4_ * auVar123._8_4_;
          auVar32._12_4_ = auVar237._12_4_ * auVar123._12_4_;
          auVar32._16_4_ = auVar237._16_4_ * auVar123._16_4_;
          auVar32._20_4_ = auVar237._20_4_ * auVar123._20_4_;
          auVar32._24_4_ = auVar237._24_4_ * auVar123._24_4_;
          auVar32._28_4_ = auVar123._28_4_;
          auVar123 = vsubps_avx(auVar165,auVar217._0_32_);
          auVar33._4_4_ = auVar239._4_4_ * auVar123._4_4_;
          auVar33._0_4_ = auVar239._0_4_ * auVar123._0_4_;
          auVar33._8_4_ = auVar239._8_4_ * auVar123._8_4_;
          auVar33._12_4_ = auVar239._12_4_ * auVar123._12_4_;
          auVar33._16_4_ = auVar239._16_4_ * auVar123._16_4_;
          auVar33._20_4_ = auVar239._20_4_ * auVar123._20_4_;
          auVar33._24_4_ = auVar239._24_4_ * auVar123._24_4_;
          auVar33._28_4_ = auVar123._28_4_;
          auVar123 = vminps_avx(auVar32,auVar33);
          auVar26 = vsubps_avx(auVar183,auVar223._0_32_);
          auVar34._4_4_ = auVar242._4_4_ * auVar26._4_4_;
          auVar34._0_4_ = auVar242._0_4_ * auVar26._0_4_;
          auVar34._8_4_ = auVar242._8_4_ * auVar26._8_4_;
          auVar34._12_4_ = auVar242._12_4_ * auVar26._12_4_;
          auVar34._16_4_ = auVar242._16_4_ * auVar26._16_4_;
          auVar34._20_4_ = auVar242._20_4_ * auVar26._20_4_;
          auVar34._24_4_ = auVar242._24_4_ * auVar26._24_4_;
          auVar34._28_4_ = auVar26._28_4_;
          auVar26 = vminps_avx(auVar34,auVar89._0_32_);
          auVar26 = vminps_avx(auVar123,auVar26);
          auVar123 = vcmpps_avx(local_27c0,auVar26,2);
          auVar108 = vpcmpeqd_avx(auVar26._0_16_,auVar26._0_16_);
          auVar86 = vpmovsxbd_avx(auVar86 ^ auVar108);
          auVar122 = vpmovsxbd_avx(auVar122 ^ auVar108);
          auVar99._16_16_ = auVar122;
          auVar99._0_16_ = auVar86;
          auVar26 = vcvtdq2ps_avx(auVar99);
          auVar110._8_4_ = 0xbf800000;
          auVar110._0_8_ = 0xbf800000bf800000;
          auVar110._12_4_ = 0xbf800000;
          auVar110._16_4_ = 0xbf800000;
          auVar110._20_4_ = 0xbf800000;
          auVar110._24_4_ = 0xbf800000;
          auVar110._28_4_ = 0xbf800000;
          auVar26 = vcmpps_avx(auVar110,auVar26,1);
          auVar123 = vandps_avx(auVar123,auVar26);
          uVar70 = vmovmskps_avx(auVar123);
          if (uVar70 == 0) goto LAB_00e76789;
          uVar70 = uVar70 & 0xff;
          lVar78 = 0;
          if (uVar70 != 0) {
            for (; (uVar70 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
            }
          }
          uVar77 = *(ulong *)(uVar83 + lVar78 * 8);
          uVar70 = uVar70 - 1 & uVar70;
          if (uVar70 != 0) {
            uVar76 = *(uint *)(local_27c0 + lVar78 * 4);
            lVar78 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar83 + lVar78 * 8);
            uVar75 = *(uint *)(local_27c0 + lVar78 * 4);
            uVar70 = uVar70 - 1 & uVar70;
            if (uVar70 == 0) {
              if (uVar76 < uVar75) {
                *(ulong *)*local_2958 = uVar5;
                *(uint *)(*local_2958 + 8) = uVar75;
                local_2958 = local_2958 + 1;
              }
              else {
                *(ulong *)*local_2958 = uVar77;
                *(uint *)(*local_2958 + 8) = uVar76;
                local_2958 = local_2958 + 1;
                uVar77 = uVar5;
              }
            }
            else {
              auVar97._8_8_ = 0;
              auVar97._0_8_ = uVar77;
              auVar86 = vpunpcklqdq_avx(auVar97,ZEXT416(uVar76));
              auVar109._8_8_ = 0;
              auVar109._0_8_ = uVar5;
              auVar122 = vpunpcklqdq_avx(auVar109,ZEXT416(uVar75));
              lVar78 = 0;
              if (uVar70 != 0) {
                for (; (uVar70 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
                }
              }
              auVar121._8_8_ = 0;
              auVar121._0_8_ = *(ulong *)(uVar83 + lVar78 * 8);
              auVar142 = vpunpcklqdq_avx(auVar121,ZEXT416(*(uint *)(local_27c0 + lVar78 * 4)));
              auVar108 = vpcmpgtd_avx(auVar122,auVar86);
              uVar70 = uVar70 - 1 & uVar70;
              if (uVar70 == 0) {
                auVar117 = vpshufd_avx(auVar108,0xaa);
                auVar108 = vblendvps_avx(auVar122,auVar86,auVar117);
                auVar86 = vblendvps_avx(auVar86,auVar122,auVar117);
                auVar122 = vpcmpgtd_avx(auVar142,auVar108);
                auVar117 = vpshufd_avx(auVar122,0xaa);
                auVar122 = vblendvps_avx(auVar142,auVar108,auVar117);
                auVar108 = vblendvps_avx(auVar108,auVar142,auVar117);
                auVar142 = vpcmpgtd_avx(auVar108,auVar86);
                auVar117 = vpshufd_avx(auVar142,0xaa);
                auVar142 = vblendvps_avx(auVar108,auVar86,auVar117);
                auVar86 = vblendvps_avx(auVar86,auVar108,auVar117);
                *local_2958 = auVar86;
                local_2958[1] = auVar142;
                uVar77 = auVar122._0_8_;
                local_2958 = local_2958 + 2;
              }
              else {
                lVar78 = 0;
                if (uVar70 != 0) {
                  for (; (uVar70 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
                  }
                }
                auVar145._8_8_ = 0;
                auVar145._0_8_ = *(ulong *)(uVar83 + lVar78 * 8);
                auVar117 = vpunpcklqdq_avx(auVar145,ZEXT416(*(uint *)(local_27c0 + lVar78 * 4)));
                uVar70 = uVar70 - 1 & uVar70;
                uVar77 = (ulong)uVar70;
                if (uVar70 == 0) {
                  auVar143 = vpshufd_avx(auVar108,0xaa);
                  auVar108 = vblendvps_avx(auVar122,auVar86,auVar143);
                  auVar86 = vblendvps_avx(auVar86,auVar122,auVar143);
                  auVar122 = vpcmpgtd_avx(auVar117,auVar142);
                  auVar143 = vpshufd_avx(auVar122,0xaa);
                  auVar122 = vblendvps_avx(auVar117,auVar142,auVar143);
                  auVar142 = vblendvps_avx(auVar142,auVar117,auVar143);
                  auVar117 = vpcmpgtd_avx(auVar142,auVar86);
                  auVar143 = vpshufd_avx(auVar117,0xaa);
                  auVar117 = vblendvps_avx(auVar142,auVar86,auVar143);
                  auVar86 = vblendvps_avx(auVar86,auVar142,auVar143);
                  auVar142 = vpcmpgtd_avx(auVar122,auVar108);
                  auVar143 = vpshufd_avx(auVar142,0xaa);
                  auVar142 = vblendvps_avx(auVar122,auVar108,auVar143);
                  auVar122 = vblendvps_avx(auVar108,auVar122,auVar143);
                  auVar108 = vpcmpgtd_avx(auVar117,auVar122);
                  auVar143 = vpshufd_avx(auVar108,0xaa);
                  auVar108 = vblendvps_avx(auVar117,auVar122,auVar143);
                  auVar122 = vblendvps_avx(auVar122,auVar117,auVar143);
                  *local_2958 = auVar86;
                  local_2958[1] = auVar122;
                  local_2958[2] = auVar108;
                  local_2958 = local_2958 + 3;
                  uVar77 = auVar142._0_8_;
                }
                else {
                  *local_2958 = auVar86;
                  local_2958[1] = auVar122;
                  local_2958[2] = auVar142;
                  pauVar74 = local_2958 + 3;
                  local_2958[3] = auVar117;
                  do {
                    lVar78 = 0;
                    if (uVar77 != 0) {
                      for (; (uVar77 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
                      }
                    }
                    auVar98._8_8_ = 0;
                    auVar98._0_8_ = *(ulong *)(uVar83 + lVar78 * 8);
                    auVar86 = vpunpcklqdq_avx(auVar98,ZEXT416(*(uint *)(local_27c0 + lVar78 * 4)));
                    pauVar74[1] = auVar86;
                    pauVar74 = pauVar74 + 1;
                    uVar77 = uVar77 & uVar77 - 1;
                  } while (uVar77 != 0);
                  lVar78 = 0;
                  while (pauVar74 != local_2958) {
                    auVar86 = local_2958[1];
                    uVar70 = vextractps_avx(auVar86,2);
                    for (lVar80 = 0x10;
                        (lVar78 != lVar80 && (*(uint *)(local_2958[-1] + lVar80 + 8) < uVar70));
                        lVar80 = lVar80 + -0x10) {
                      *(undefined1 (*) [16])(*local_2958 + lVar80) =
                           *(undefined1 (*) [16])(local_2958[-1] + lVar80);
                    }
                    *(undefined1 (*) [16])(*local_2958 + lVar80) = auVar86;
                    lVar78 = lVar78 + -0x10;
                    local_2958 = local_2958 + 1;
                  }
                  uVar77 = *(ulong *)*pauVar74;
                  local_2958 = pauVar74;
                }
              }
            }
          }
        }
        local_2900 = (ulong)((uint)uVar77 & 0xf) - 8;
        uVar77 = uVar77 & 0xfffffffffffffff0;
        for (local_28f8 = 0; local_28f8 != local_2900; local_28f8 = local_28f8 + 1) {
          lVar80 = local_28f8 * 0x60;
          pSVar6 = context->scene;
          ppfVar7 = (pSVar6->vertices).items;
          pfVar8 = ppfVar7[*(uint *)(uVar77 + 0x40 + lVar80)];
          pfVar9 = ppfVar7[*(uint *)(uVar77 + 0x44 + lVar80)];
          pfVar10 = ppfVar7[*(uint *)(uVar77 + 0x48 + lVar80)];
          pfVar11 = ppfVar7[*(uint *)(uVar77 + 0x4c + lVar80)];
          auVar108 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar77 + lVar80)),
                                   *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar77 + 8 + lVar80)))
          ;
          auVar86 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar77 + lVar80)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar77 + 8 + lVar80)));
          auVar142 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar77 + 4 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0xc + lVar80)));
          auVar122 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar77 + 4 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0xc + lVar80)));
          auVar143 = vunpcklps_avx(auVar86,auVar122);
          auVar119 = vunpcklps_avx(auVar108,auVar142);
          auVar86 = vunpckhps_avx(auVar108,auVar142);
          auVar142 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar77 + 0x10 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar77 + 0x18 + lVar80)));
          auVar122 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar77 + 0x10 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar77 + 0x18 + lVar80)));
          auVar117 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar77 + 0x14 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0x1c + lVar80)));
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar77 + 0x14 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0x1c + lVar80)));
          auVar120 = vunpcklps_avx(auVar122,auVar108);
          auVar136 = vunpcklps_avx(auVar142,auVar117);
          auVar122 = vunpckhps_avx(auVar142,auVar117);
          auVar117 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar77 + 0x20 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar77 + 0x28 + lVar80)));
          auVar108 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar77 + 0x20 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar77 + 0x28 + lVar80)));
          auVar144 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar77 + 0x24 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0x2c + lVar80)));
          auVar142 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar77 + 0x24 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0x2c + lVar80)));
          auVar162 = vunpcklps_avx(auVar108,auVar142);
          auVar163 = vunpcklps_avx(auVar117,auVar144);
          auVar108 = vunpckhps_avx(auVar117,auVar144);
          auVar144 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar77 + 0x30 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar77 + 0x38 + lVar80)));
          auVar142 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar77 + 0x30 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar77 + 0x38 + lVar80)));
          auVar168 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar77 + 0x34 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0x3c + lVar80)));
          auVar117 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar77 + 0x34 + lVar80)),
                                   *(undefined1 (*) [16])
                                    (pfVar11 + *(uint *)(uVar77 + 0x3c + lVar80)));
          auVar117 = vunpcklps_avx(auVar142,auVar117);
          auVar169 = vunpcklps_avx(auVar144,auVar168);
          lVar78 = uVar77 + 0x40 + lVar80;
          local_23c0 = *(undefined8 *)(lVar78 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar78 + 0x18);
          auVar142 = vunpckhps_avx(auVar144,auVar168);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar80 = uVar77 + 0x50 + lVar80;
          local_27e0 = *(undefined8 *)(lVar80 + 0x10);
          uStack_27d8 = *(undefined8 *)(lVar80 + 0x18);
          uStack_27d0 = local_27e0;
          uStack_27c8 = uStack_27d8;
          auVar148._16_16_ = auVar163;
          auVar148._0_16_ = auVar119;
          auVar172._16_16_ = auVar108;
          auVar172._0_16_ = auVar86;
          auVar241._16_16_ = auVar162;
          auVar241._0_16_ = auVar143;
          auVar166._16_16_ = auVar136;
          auVar166._0_16_ = auVar136;
          auVar207._16_16_ = auVar122;
          auVar207._0_16_ = auVar122;
          auVar111._16_16_ = auVar120;
          auVar111._0_16_ = auVar120;
          auVar214._16_16_ = auVar169;
          auVar214._0_16_ = auVar169;
          auVar184._16_16_ = auVar142;
          auVar184._0_16_ = auVar142;
          auVar125._16_16_ = auVar117;
          auVar125._0_16_ = auVar117;
          uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar221._4_4_ = uVar3;
          auVar221._0_4_ = uVar3;
          auVar221._8_4_ = uVar3;
          auVar221._12_4_ = uVar3;
          auVar221._16_4_ = uVar3;
          auVar221._20_4_ = uVar3;
          auVar221._24_4_ = uVar3;
          auVar221._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar236._4_4_ = uVar3;
          auVar236._0_4_ = uVar3;
          auVar236._8_4_ = uVar3;
          auVar236._12_4_ = uVar3;
          auVar236._16_4_ = uVar3;
          auVar236._20_4_ = uVar3;
          auVar236._24_4_ = uVar3;
          auVar236._28_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar238._4_4_ = uVar3;
          auVar238._0_4_ = uVar3;
          auVar238._8_4_ = uVar3;
          auVar238._12_4_ = uVar3;
          auVar238._16_4_ = uVar3;
          auVar238._20_4_ = uVar3;
          auVar238._24_4_ = uVar3;
          auVar238._28_4_ = uVar3;
          local_2800 = vsubps_avx(auVar148,auVar221);
          local_2820 = vsubps_avx(auVar172,auVar236);
          local_2400 = vsubps_avx(auVar241,auVar238);
          auVar123 = vsubps_avx(auVar166,auVar221);
          auVar26 = vsubps_avx(auVar207,auVar236);
          auVar30 = vsubps_avx(auVar111,auVar238);
          auVar31 = vsubps_avx(auVar214,auVar221);
          auVar32 = vsubps_avx(auVar184,auVar236);
          auVar33 = vsubps_avx(auVar125,auVar238);
          local_2420 = vsubps_avx(auVar31,local_2800);
          local_2440 = vsubps_avx(auVar32,local_2820);
          local_2460 = vsubps_avx(auVar33,local_2400);
          fVar27 = local_2820._0_4_;
          fVar140 = auVar32._0_4_ + fVar27;
          fVar13 = local_2820._4_4_;
          fVar149 = auVar32._4_4_ + fVar13;
          fVar112 = local_2820._8_4_;
          fVar151 = auVar32._8_4_ + fVar112;
          fVar115 = local_2820._12_4_;
          fVar153 = auVar32._12_4_ + fVar115;
          fVar17 = local_2820._16_4_;
          fVar155 = auVar32._16_4_ + fVar17;
          fVar20 = local_2820._20_4_;
          fVar157 = auVar32._20_4_ + fVar20;
          fVar23 = local_2820._24_4_;
          fVar159 = auVar32._24_4_ + fVar23;
          fVar96 = local_2820._28_4_;
          fVar28 = local_2400._0_4_;
          fVar174 = auVar33._0_4_ + fVar28;
          fVar14 = local_2400._4_4_;
          fVar185 = auVar33._4_4_ + fVar14;
          fVar113 = local_2400._8_4_;
          fVar188 = auVar33._8_4_ + fVar113;
          fVar116 = local_2400._12_4_;
          fVar191 = auVar33._12_4_ + fVar116;
          fVar18 = local_2400._16_4_;
          fVar194 = auVar33._16_4_ + fVar18;
          fVar21 = local_2400._20_4_;
          fVar197 = auVar33._20_4_ + fVar21;
          fVar24 = local_2400._24_4_;
          fVar200 = auVar33._24_4_ + fVar24;
          fVar204 = local_2400._28_4_;
          fVar85 = local_2460._0_4_;
          fVar90 = local_2460._4_4_;
          auVar35._4_4_ = fVar90 * fVar149;
          auVar35._0_4_ = fVar85 * fVar140;
          fVar91 = local_2460._8_4_;
          auVar35._8_4_ = fVar91 * fVar151;
          fVar92 = local_2460._12_4_;
          auVar35._12_4_ = fVar92 * fVar153;
          fVar93 = local_2460._16_4_;
          auVar35._16_4_ = fVar93 * fVar155;
          fVar94 = local_2460._20_4_;
          auVar35._20_4_ = fVar94 * fVar157;
          fVar95 = local_2460._24_4_;
          auVar35._24_4_ = fVar95 * fVar159;
          auVar35._28_4_ = auVar122._12_4_;
          fVar219 = local_2440._0_4_;
          fVar224 = local_2440._4_4_;
          auVar36._4_4_ = fVar224 * fVar185;
          auVar36._0_4_ = fVar219 * fVar174;
          fVar226 = local_2440._8_4_;
          auVar36._8_4_ = fVar226 * fVar188;
          fVar228 = local_2440._12_4_;
          auVar36._12_4_ = fVar228 * fVar191;
          fVar230 = local_2440._16_4_;
          auVar36._16_4_ = fVar230 * fVar194;
          fVar232 = local_2440._20_4_;
          auVar36._20_4_ = fVar232 * fVar197;
          fVar234 = local_2440._24_4_;
          auVar36._24_4_ = fVar234 * fVar200;
          auVar36._28_4_ = auVar169._12_4_;
          auVar34 = vsubps_avx(auVar36,auVar35);
          fVar29 = local_2800._0_4_;
          fVar203 = auVar31._0_4_ + fVar29;
          fVar15 = local_2800._4_4_;
          fVar208 = auVar31._4_4_ + fVar15;
          fVar114 = local_2800._8_4_;
          fVar209 = auVar31._8_4_ + fVar114;
          fVar16 = local_2800._12_4_;
          fVar210 = auVar31._12_4_ + fVar16;
          fVar19 = local_2800._16_4_;
          fVar211 = auVar31._16_4_ + fVar19;
          fVar22 = local_2800._20_4_;
          fVar212 = auVar31._20_4_ + fVar22;
          fVar25 = local_2800._24_4_;
          fVar213 = auVar31._24_4_ + fVar25;
          fVar106 = local_2420._0_4_;
          fVar107 = local_2420._4_4_;
          auVar37._4_4_ = fVar185 * fVar107;
          auVar37._0_4_ = fVar174 * fVar106;
          fVar174 = local_2420._8_4_;
          auVar37._8_4_ = fVar188 * fVar174;
          fVar185 = local_2420._12_4_;
          auVar37._12_4_ = fVar191 * fVar185;
          fVar188 = local_2420._16_4_;
          auVar37._16_4_ = fVar194 * fVar188;
          fVar191 = local_2420._20_4_;
          auVar37._20_4_ = fVar197 * fVar191;
          fVar194 = local_2420._24_4_;
          auVar37._24_4_ = fVar200 * fVar194;
          auVar37._28_4_ = auVar33._28_4_ + fVar204;
          auVar38._4_4_ = fVar208 * fVar90;
          auVar38._0_4_ = fVar203 * fVar85;
          auVar38._8_4_ = fVar209 * fVar91;
          auVar38._12_4_ = fVar210 * fVar92;
          auVar38._16_4_ = fVar211 * fVar93;
          auVar38._20_4_ = fVar212 * fVar94;
          auVar38._24_4_ = fVar213 * fVar95;
          auVar38._28_4_ = auVar169._12_4_;
          auVar99 = vsubps_avx(auVar38,auVar37);
          auVar39._4_4_ = fVar224 * fVar208;
          auVar39._0_4_ = fVar219 * fVar203;
          auVar39._8_4_ = fVar226 * fVar209;
          auVar39._12_4_ = fVar228 * fVar210;
          auVar39._16_4_ = fVar230 * fVar211;
          auVar39._20_4_ = fVar232 * fVar212;
          auVar39._24_4_ = fVar234 * fVar213;
          auVar39._28_4_ = auVar31._28_4_ + local_2800._28_4_;
          auVar40._4_4_ = fVar107 * fVar149;
          auVar40._0_4_ = fVar106 * fVar140;
          auVar40._8_4_ = fVar174 * fVar151;
          auVar40._12_4_ = fVar185 * fVar153;
          auVar40._16_4_ = fVar188 * fVar155;
          auVar40._20_4_ = fVar191 * fVar157;
          auVar40._24_4_ = fVar194 * fVar159;
          auVar40._28_4_ = auVar32._28_4_ + fVar96;
          auVar110 = vsubps_avx(auVar40,auVar39);
          local_28a0._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar140 = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_28c0._4_4_ = fVar140;
          local_28c0._0_4_ = fVar140;
          local_28c0._8_4_ = fVar140;
          local_28c0._12_4_ = fVar140;
          local_28c0._16_4_ = fVar140;
          local_28c0._20_4_ = fVar140;
          local_28c0._24_4_ = fVar140;
          local_28c0._28_4_ = fVar140;
          local_2920._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_24c0._0_4_ =
               auVar34._0_4_ * local_2920._4_4_ +
               local_28a0._4_4_ * auVar99._0_4_ + fVar140 * auVar110._0_4_;
          local_24c0._4_4_ =
               auVar34._4_4_ * local_2920._4_4_ +
               local_28a0._4_4_ * auVar99._4_4_ + fVar140 * auVar110._4_4_;
          local_24c0._8_4_ =
               auVar34._8_4_ * local_2920._4_4_ +
               local_28a0._4_4_ * auVar99._8_4_ + fVar140 * auVar110._8_4_;
          local_24c0._12_4_ =
               auVar34._12_4_ * local_2920._4_4_ +
               local_28a0._4_4_ * auVar99._12_4_ + fVar140 * auVar110._12_4_;
          local_24c0._16_4_ =
               auVar34._16_4_ * local_2920._4_4_ +
               local_28a0._4_4_ * auVar99._16_4_ + fVar140 * auVar110._16_4_;
          local_24c0._20_4_ =
               auVar34._20_4_ * local_2920._4_4_ +
               local_28a0._4_4_ * auVar99._20_4_ + fVar140 * auVar110._20_4_;
          local_24c0._24_4_ =
               auVar34._24_4_ * local_2920._4_4_ +
               local_28a0._4_4_ * auVar99._24_4_ + fVar140 * auVar110._24_4_;
          local_24c0._28_4_ = auVar99._28_4_ + auVar99._28_4_ + auVar110._28_4_;
          auVar34 = vsubps_avx(local_2820,auVar26);
          local_24a0 = vsubps_avx(local_2400,auVar30);
          fVar208 = fVar27 + auVar26._0_4_;
          fVar209 = fVar13 + auVar26._4_4_;
          fVar210 = fVar112 + auVar26._8_4_;
          fVar211 = fVar115 + auVar26._12_4_;
          fVar212 = fVar17 + auVar26._16_4_;
          fVar213 = fVar20 + auVar26._20_4_;
          fVar160 = fVar23 + auVar26._24_4_;
          fVar149 = auVar26._28_4_;
          fVar153 = fVar28 + auVar30._0_4_;
          fVar155 = fVar14 + auVar30._4_4_;
          fVar157 = fVar113 + auVar30._8_4_;
          fVar159 = fVar116 + auVar30._12_4_;
          fVar197 = fVar18 + auVar30._16_4_;
          fVar200 = fVar21 + auVar30._20_4_;
          fVar203 = fVar24 + auVar30._24_4_;
          fVar151 = auVar30._28_4_;
          fVar220 = local_24a0._0_4_;
          fVar225 = local_24a0._4_4_;
          auVar41._4_4_ = fVar225 * fVar209;
          auVar41._0_4_ = fVar220 * fVar208;
          fVar227 = local_24a0._8_4_;
          auVar41._8_4_ = fVar227 * fVar210;
          fVar229 = local_24a0._12_4_;
          auVar41._12_4_ = fVar229 * fVar211;
          fVar231 = local_24a0._16_4_;
          auVar41._16_4_ = fVar231 * fVar212;
          fVar233 = local_24a0._20_4_;
          auVar41._20_4_ = fVar233 * fVar213;
          fVar235 = local_24a0._24_4_;
          auVar41._24_4_ = fVar235 * fVar160;
          auVar41._28_4_ = fVar204;
          fVar175 = auVar34._0_4_;
          fVar186 = auVar34._4_4_;
          auVar42._4_4_ = fVar186 * fVar155;
          auVar42._0_4_ = fVar175 * fVar153;
          fVar189 = auVar34._8_4_;
          auVar42._8_4_ = fVar189 * fVar157;
          fVar192 = auVar34._12_4_;
          auVar42._12_4_ = fVar192 * fVar159;
          fVar195 = auVar34._16_4_;
          auVar42._16_4_ = fVar195 * fVar197;
          fVar198 = auVar34._20_4_;
          auVar42._20_4_ = fVar198 * fVar200;
          fVar201 = auVar34._24_4_;
          auVar42._24_4_ = fVar201 * fVar203;
          auVar42._28_4_ = fVar96;
          auVar34 = vsubps_avx(auVar42,auVar41);
          auVar99 = vsubps_avx(local_2800,auVar123);
          fVar240 = auVar99._0_4_;
          fVar243 = auVar99._4_4_;
          auVar43._4_4_ = fVar243 * fVar155;
          auVar43._0_4_ = fVar240 * fVar153;
          fVar244 = auVar99._8_4_;
          auVar43._8_4_ = fVar244 * fVar157;
          fVar245 = auVar99._12_4_;
          auVar43._12_4_ = fVar245 * fVar159;
          fVar246 = auVar99._16_4_;
          auVar43._16_4_ = fVar246 * fVar197;
          fVar247 = auVar99._20_4_;
          auVar43._20_4_ = fVar247 * fVar200;
          fVar248 = auVar99._24_4_;
          auVar43._24_4_ = fVar248 * fVar203;
          auVar43._28_4_ = fVar204 + fVar151;
          fVar204 = auVar123._0_4_ + fVar29;
          fVar153 = auVar123._4_4_ + fVar15;
          fVar155 = auVar123._8_4_ + fVar114;
          fVar157 = auVar123._12_4_ + fVar16;
          fVar159 = auVar123._16_4_ + fVar19;
          fVar197 = auVar123._20_4_ + fVar22;
          fVar200 = auVar123._24_4_ + fVar25;
          auVar44._4_4_ = fVar225 * fVar153;
          auVar44._0_4_ = fVar220 * fVar204;
          auVar44._8_4_ = fVar227 * fVar155;
          auVar44._12_4_ = fVar229 * fVar157;
          auVar44._16_4_ = fVar231 * fVar159;
          auVar44._20_4_ = fVar233 * fVar197;
          auVar44._24_4_ = fVar235 * fVar200;
          auVar44._28_4_ = local_24a0._28_4_;
          auVar99 = vsubps_avx(auVar44,auVar43);
          auVar45._4_4_ = fVar186 * fVar153;
          auVar45._0_4_ = fVar175 * fVar204;
          auVar45._8_4_ = fVar189 * fVar155;
          auVar45._12_4_ = fVar192 * fVar157;
          auVar45._16_4_ = fVar195 * fVar159;
          auVar45._20_4_ = fVar198 * fVar197;
          auVar45._24_4_ = fVar201 * fVar200;
          auVar45._28_4_ = auVar123._28_4_ + local_2800._28_4_;
          auVar46._4_4_ = fVar243 * fVar209;
          auVar46._0_4_ = fVar240 * fVar208;
          auVar46._8_4_ = fVar244 * fVar210;
          auVar46._12_4_ = fVar245 * fVar211;
          auVar46._16_4_ = fVar246 * fVar212;
          auVar46._20_4_ = fVar247 * fVar213;
          auVar46._24_4_ = fVar248 * fVar160;
          auVar46._28_4_ = fVar96 + fVar149;
          auVar110 = vsubps_avx(auVar46,auVar45);
          local_24e0._0_4_ =
               local_2920._4_4_ * auVar34._0_4_ +
               local_28a0._4_4_ * auVar99._0_4_ + fVar140 * auVar110._0_4_;
          local_24e0._4_4_ =
               local_2920._4_4_ * auVar34._4_4_ +
               local_28a0._4_4_ * auVar99._4_4_ + fVar140 * auVar110._4_4_;
          local_24e0._8_4_ =
               local_2920._4_4_ * auVar34._8_4_ +
               local_28a0._4_4_ * auVar99._8_4_ + fVar140 * auVar110._8_4_;
          local_24e0._12_4_ =
               local_2920._4_4_ * auVar34._12_4_ +
               local_28a0._4_4_ * auVar99._12_4_ + fVar140 * auVar110._12_4_;
          local_24e0._16_4_ =
               local_2920._4_4_ * auVar34._16_4_ +
               local_28a0._4_4_ * auVar99._16_4_ + fVar140 * auVar110._16_4_;
          local_24e0._20_4_ =
               local_2920._4_4_ * auVar34._20_4_ +
               local_28a0._4_4_ * auVar99._20_4_ + fVar140 * auVar110._20_4_;
          local_24e0._24_4_ =
               local_2920._4_4_ * auVar34._24_4_ +
               local_28a0._4_4_ * auVar99._24_4_ + fVar140 * auVar110._24_4_;
          local_24e0._28_4_ = auVar34._28_4_ + auVar99._28_4_ + auVar110._28_4_;
          local_2480 = vsubps_avx(auVar123,auVar31);
          fVar200 = auVar123._0_4_ + auVar31._0_4_;
          fVar203 = auVar123._4_4_ + auVar31._4_4_;
          fVar208 = auVar123._8_4_ + auVar31._8_4_;
          fVar209 = auVar123._12_4_ + auVar31._12_4_;
          fVar210 = auVar123._16_4_ + auVar31._16_4_;
          fVar211 = auVar123._20_4_ + auVar31._20_4_;
          fVar212 = auVar123._24_4_ + auVar31._24_4_;
          fVar213 = auVar123._28_4_ + auVar31._28_4_;
          auVar123 = vsubps_avx(auVar26,auVar32);
          fVar96 = auVar26._0_4_ + auVar32._0_4_;
          fVar204 = auVar26._4_4_ + auVar32._4_4_;
          fVar153 = auVar26._8_4_ + auVar32._8_4_;
          fVar155 = auVar26._12_4_ + auVar32._12_4_;
          fVar157 = auVar26._16_4_ + auVar32._16_4_;
          fVar159 = auVar26._20_4_ + auVar32._20_4_;
          fVar197 = auVar26._24_4_ + auVar32._24_4_;
          auVar26 = vsubps_avx(auVar30,auVar33);
          fVar160 = auVar30._0_4_ + auVar33._0_4_;
          fVar130 = auVar30._4_4_ + auVar33._4_4_;
          fVar131 = auVar30._8_4_ + auVar33._8_4_;
          fVar132 = auVar30._12_4_ + auVar33._12_4_;
          fVar133 = auVar30._16_4_ + auVar33._16_4_;
          fVar134 = auVar30._20_4_ + auVar33._20_4_;
          fVar135 = auVar30._24_4_ + auVar33._24_4_;
          fVar141 = auVar26._0_4_;
          fVar150 = auVar26._4_4_;
          auVar47._4_4_ = fVar150 * fVar204;
          auVar47._0_4_ = fVar141 * fVar96;
          fVar152 = auVar26._8_4_;
          auVar47._8_4_ = fVar152 * fVar153;
          fVar154 = auVar26._12_4_;
          auVar47._12_4_ = fVar154 * fVar155;
          fVar156 = auVar26._16_4_;
          auVar47._16_4_ = fVar156 * fVar157;
          fVar158 = auVar26._20_4_;
          auVar47._20_4_ = fVar158 * fVar159;
          fVar161 = auVar26._24_4_;
          auVar47._24_4_ = fVar161 * fVar197;
          auVar47._28_4_ = auVar34._28_4_;
          fVar176 = auVar123._0_4_;
          fVar187 = auVar123._4_4_;
          auVar48._4_4_ = fVar187 * fVar130;
          auVar48._0_4_ = fVar176 * fVar160;
          fVar190 = auVar123._8_4_;
          auVar48._8_4_ = fVar190 * fVar131;
          fVar193 = auVar123._12_4_;
          auVar48._12_4_ = fVar193 * fVar132;
          fVar196 = auVar123._16_4_;
          auVar48._16_4_ = fVar196 * fVar133;
          fVar199 = auVar123._20_4_;
          auVar48._20_4_ = fVar199 * fVar134;
          fVar202 = auVar123._24_4_;
          auVar48._24_4_ = fVar202 * fVar135;
          auVar48._28_4_ = fVar149;
          auVar123 = vsubps_avx(auVar48,auVar47);
          fVar216 = local_2480._0_4_;
          fVar218 = local_2480._4_4_;
          auVar49._4_4_ = fVar218 * fVar130;
          auVar49._0_4_ = fVar216 * fVar160;
          fVar160 = local_2480._8_4_;
          auVar49._8_4_ = fVar160 * fVar131;
          fVar130 = local_2480._12_4_;
          auVar49._12_4_ = fVar130 * fVar132;
          fVar131 = local_2480._16_4_;
          auVar49._16_4_ = fVar131 * fVar133;
          fVar132 = local_2480._20_4_;
          auVar49._20_4_ = fVar132 * fVar134;
          fVar133 = local_2480._24_4_;
          auVar49._24_4_ = fVar133 * fVar135;
          auVar49._28_4_ = fVar151 + auVar33._28_4_;
          auVar50._4_4_ = fVar150 * fVar203;
          auVar50._0_4_ = fVar141 * fVar200;
          auVar50._8_4_ = fVar152 * fVar208;
          auVar50._12_4_ = fVar154 * fVar209;
          auVar50._16_4_ = fVar156 * fVar210;
          auVar50._20_4_ = fVar158 * fVar211;
          auVar50._24_4_ = fVar161 * fVar212;
          auVar50._28_4_ = fVar149;
          auVar26 = vsubps_avx(auVar50,auVar49);
          auVar51._4_4_ = fVar187 * fVar203;
          auVar51._0_4_ = fVar176 * fVar200;
          auVar51._8_4_ = fVar190 * fVar208;
          auVar51._12_4_ = fVar193 * fVar209;
          auVar51._16_4_ = fVar196 * fVar210;
          auVar51._20_4_ = fVar199 * fVar211;
          auVar51._24_4_ = fVar202 * fVar212;
          auVar51._28_4_ = fVar213;
          auVar31 = local_2480;
          auVar52._4_4_ = fVar218 * fVar204;
          auVar52._0_4_ = fVar216 * fVar96;
          auVar52._8_4_ = fVar160 * fVar153;
          auVar52._12_4_ = fVar130 * fVar155;
          auVar52._16_4_ = fVar131 * fVar157;
          auVar52._20_4_ = fVar132 * fVar159;
          auVar52._24_4_ = fVar133 * fVar197;
          auVar52._28_4_ = fVar149 + auVar32._28_4_;
          auVar30 = vsubps_avx(auVar52,auVar51);
          local_28a0._0_4_ = local_28a0._4_4_;
          fStack_2898 = local_28a0._4_4_;
          fStack_2894 = local_28a0._4_4_;
          fStack_2890 = local_28a0._4_4_;
          fStack_288c = local_28a0._4_4_;
          fStack_2888 = local_28a0._4_4_;
          fStack_2884 = local_28a0._4_4_;
          local_2920._0_4_ = local_2920._4_4_;
          fStack_2918 = local_2920._4_4_;
          fStack_2914 = local_2920._4_4_;
          fStack_2910 = local_2920._4_4_;
          fStack_290c = local_2920._4_4_;
          fStack_2908 = local_2920._4_4_;
          fStack_2904 = local_2920._4_4_;
          auVar100._0_4_ =
               local_2920._4_4_ * auVar123._0_4_ +
               local_28a0._4_4_ * auVar26._0_4_ + fVar140 * auVar30._0_4_;
          auVar100._4_4_ =
               local_2920._4_4_ * auVar123._4_4_ +
               local_28a0._4_4_ * auVar26._4_4_ + fVar140 * auVar30._4_4_;
          auVar100._8_4_ =
               local_2920._4_4_ * auVar123._8_4_ +
               local_28a0._4_4_ * auVar26._8_4_ + fVar140 * auVar30._8_4_;
          auVar100._12_4_ =
               local_2920._4_4_ * auVar123._12_4_ +
               local_28a0._4_4_ * auVar26._12_4_ + fVar140 * auVar30._12_4_;
          auVar100._16_4_ =
               local_2920._4_4_ * auVar123._16_4_ +
               local_28a0._4_4_ * auVar26._16_4_ + fVar140 * auVar30._16_4_;
          auVar100._20_4_ =
               local_2920._4_4_ * auVar123._20_4_ +
               local_28a0._4_4_ * auVar26._20_4_ + fVar140 * auVar30._20_4_;
          auVar100._24_4_ =
               local_2920._4_4_ * auVar123._24_4_ +
               local_28a0._4_4_ * auVar26._24_4_ + fVar140 * auVar30._24_4_;
          auVar100._28_4_ = fVar213 + fVar213 + auVar30._28_4_;
          local_2520._0_4_ = auVar100._0_4_ + local_24c0._0_4_ + local_24e0._0_4_;
          local_2520._4_4_ = auVar100._4_4_ + local_24c0._4_4_ + local_24e0._4_4_;
          local_2520._8_4_ = auVar100._8_4_ + local_24c0._8_4_ + local_24e0._8_4_;
          local_2520._12_4_ = auVar100._12_4_ + local_24c0._12_4_ + local_24e0._12_4_;
          local_2520._16_4_ = auVar100._16_4_ + local_24c0._16_4_ + local_24e0._16_4_;
          local_2520._20_4_ = auVar100._20_4_ + local_24c0._20_4_ + local_24e0._20_4_;
          local_2520._24_4_ = auVar100._24_4_ + local_24c0._24_4_ + local_24e0._24_4_;
          local_2520._28_4_ = auVar100._28_4_ + local_24c0._28_4_ + local_24e0._28_4_;
          auVar123 = vminps_avx(local_24c0,local_24e0);
          auVar123 = vminps_avx(auVar123,auVar100);
          auVar126._8_4_ = 0x7fffffff;
          auVar126._0_8_ = 0x7fffffff7fffffff;
          auVar126._12_4_ = 0x7fffffff;
          auVar126._16_4_ = 0x7fffffff;
          auVar126._20_4_ = 0x7fffffff;
          auVar126._24_4_ = 0x7fffffff;
          auVar126._28_4_ = 0x7fffffff;
          local_2500 = vandps_avx(local_2520,auVar126);
          fVar96 = local_2500._0_4_ * 1.1920929e-07;
          fVar204 = local_2500._4_4_ * 1.1920929e-07;
          auVar53._4_4_ = fVar204;
          auVar53._0_4_ = fVar96;
          fVar149 = local_2500._8_4_ * 1.1920929e-07;
          auVar53._8_4_ = fVar149;
          fVar153 = local_2500._12_4_ * 1.1920929e-07;
          auVar53._12_4_ = fVar153;
          fVar155 = local_2500._16_4_ * 1.1920929e-07;
          auVar53._16_4_ = fVar155;
          fVar157 = local_2500._20_4_ * 1.1920929e-07;
          auVar53._20_4_ = fVar157;
          fVar159 = local_2500._24_4_ * 1.1920929e-07;
          auVar53._24_4_ = fVar159;
          auVar53._28_4_ = 0x34000000;
          auVar138._0_8_ = CONCAT44(fVar204,fVar96) ^ 0x8000000080000000;
          auVar138._8_4_ = -fVar149;
          auVar138._12_4_ = -fVar153;
          auVar138._16_4_ = -fVar155;
          auVar138._20_4_ = -fVar157;
          auVar138._24_4_ = -fVar159;
          auVar138._28_4_ = 0xb4000000;
          auVar123 = vcmpps_avx(auVar123,auVar138,5);
          auVar30 = vmaxps_avx(local_24c0,local_24e0);
          auVar26 = vmaxps_avx(auVar30,auVar100);
          auVar26 = vcmpps_avx(auVar26,auVar53,2);
          auVar26 = vorps_avx(auVar123,auVar26);
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            auVar54._4_4_ = fVar186 * fVar90;
            auVar54._0_4_ = fVar175 * fVar85;
            auVar54._8_4_ = fVar189 * fVar91;
            auVar54._12_4_ = fVar192 * fVar92;
            auVar54._16_4_ = fVar195 * fVar93;
            auVar54._20_4_ = fVar198 * fVar94;
            auVar54._24_4_ = fVar201 * fVar95;
            auVar54._28_4_ = auVar123._28_4_;
            auVar55._4_4_ = fVar224 * fVar225;
            auVar55._0_4_ = fVar219 * fVar220;
            auVar55._8_4_ = fVar226 * fVar227;
            auVar55._12_4_ = fVar228 * fVar229;
            auVar55._16_4_ = fVar230 * fVar231;
            auVar55._20_4_ = fVar232 * fVar233;
            auVar55._24_4_ = fVar234 * fVar235;
            auVar55._28_4_ = 0x34000000;
            auVar32 = vsubps_avx(auVar55,auVar54);
            auVar56._4_4_ = fVar187 * fVar225;
            auVar56._0_4_ = fVar176 * fVar220;
            auVar56._8_4_ = fVar190 * fVar227;
            auVar56._12_4_ = fVar193 * fVar229;
            auVar56._16_4_ = fVar196 * fVar231;
            auVar56._20_4_ = fVar199 * fVar233;
            auVar56._24_4_ = fVar202 * fVar235;
            auVar56._28_4_ = auVar30._28_4_;
            auVar57._4_4_ = fVar186 * fVar150;
            auVar57._0_4_ = fVar175 * fVar141;
            auVar57._8_4_ = fVar189 * fVar152;
            auVar57._12_4_ = fVar192 * fVar154;
            auVar57._16_4_ = fVar195 * fVar156;
            auVar57._20_4_ = fVar198 * fVar158;
            auVar57._24_4_ = fVar201 * fVar161;
            auVar57._28_4_ = local_24e0._28_4_;
            auVar33 = vsubps_avx(auVar57,auVar56);
            auVar222._8_4_ = 0x7fffffff;
            auVar222._0_8_ = 0x7fffffff7fffffff;
            auVar222._12_4_ = 0x7fffffff;
            auVar222._16_4_ = 0x7fffffff;
            auVar222._20_4_ = 0x7fffffff;
            auVar222._24_4_ = 0x7fffffff;
            auVar222._28_4_ = 0x7fffffff;
            auVar123 = vandps_avx(auVar222,auVar54);
            auVar30 = vandps_avx(auVar222,auVar56);
            auVar123 = vcmpps_avx(auVar123,auVar30,1);
            local_2760 = vblendvps_avx(auVar33,auVar32,auVar123);
            auVar58._4_4_ = fVar243 * fVar150;
            auVar58._0_4_ = fVar240 * fVar141;
            auVar58._8_4_ = fVar244 * fVar152;
            auVar58._12_4_ = fVar245 * fVar154;
            auVar58._16_4_ = fVar246 * fVar156;
            auVar58._20_4_ = fVar247 * fVar158;
            auVar58._24_4_ = fVar248 * fVar161;
            auVar58._28_4_ = auVar123._28_4_;
            auVar59._4_4_ = fVar243 * fVar90;
            auVar59._0_4_ = fVar240 * fVar85;
            auVar59._8_4_ = fVar244 * fVar91;
            auVar59._12_4_ = fVar245 * fVar92;
            auVar59._16_4_ = fVar246 * fVar93;
            auVar59._20_4_ = fVar247 * fVar94;
            auVar59._24_4_ = fVar248 * fVar95;
            auVar59._28_4_ = auVar32._28_4_;
            auVar60._4_4_ = fVar107 * fVar225;
            auVar60._0_4_ = fVar106 * fVar220;
            auVar60._8_4_ = fVar174 * fVar227;
            auVar60._12_4_ = fVar185 * fVar229;
            auVar60._16_4_ = fVar188 * fVar231;
            auVar60._20_4_ = fVar191 * fVar233;
            auVar60._24_4_ = fVar194 * fVar235;
            auVar60._28_4_ = auVar30._28_4_;
            auVar32 = vsubps_avx(auVar59,auVar60);
            auVar61._4_4_ = fVar225 * fVar218;
            auVar61._0_4_ = fVar220 * fVar216;
            auVar61._8_4_ = fVar227 * fVar160;
            auVar61._12_4_ = fVar229 * fVar130;
            auVar61._16_4_ = fVar231 * fVar131;
            auVar61._20_4_ = fVar233 * fVar132;
            auVar61._24_4_ = fVar235 * fVar133;
            auVar61._28_4_ = local_24a0._28_4_;
            auVar33 = vsubps_avx(auVar61,auVar58);
            auVar123 = vandps_avx(auVar222,auVar60);
            auVar30 = vandps_avx(auVar222,auVar58);
            auVar30 = vcmpps_avx(auVar123,auVar30,1);
            local_2740 = vblendvps_avx(auVar33,auVar32,auVar30);
            auVar62._4_4_ = fVar186 * fVar218;
            auVar62._0_4_ = fVar175 * fVar216;
            auVar62._8_4_ = fVar189 * fVar160;
            auVar62._12_4_ = fVar192 * fVar130;
            auVar62._16_4_ = fVar195 * fVar131;
            auVar62._20_4_ = fVar198 * fVar132;
            auVar62._24_4_ = fVar201 * fVar133;
            auVar62._28_4_ = auVar30._28_4_;
            auVar63._4_4_ = fVar107 * fVar186;
            auVar63._0_4_ = fVar106 * fVar175;
            auVar63._8_4_ = fVar174 * fVar189;
            auVar63._12_4_ = fVar185 * fVar192;
            auVar63._16_4_ = fVar188 * fVar195;
            auVar63._20_4_ = fVar191 * fVar198;
            auVar63._24_4_ = fVar194 * fVar201;
            auVar63._28_4_ = auVar32._28_4_;
            auVar64._4_4_ = fVar224 * fVar243;
            auVar64._0_4_ = fVar219 * fVar240;
            auVar64._8_4_ = fVar226 * fVar244;
            auVar64._12_4_ = fVar228 * fVar245;
            auVar64._16_4_ = fVar230 * fVar246;
            auVar64._20_4_ = fVar232 * fVar247;
            auVar64._24_4_ = fVar234 * fVar248;
            auVar64._28_4_ = auVar123._28_4_;
            auVar65._4_4_ = fVar243 * fVar187;
            auVar65._0_4_ = fVar240 * fVar176;
            auVar65._8_4_ = fVar244 * fVar190;
            auVar65._12_4_ = fVar245 * fVar193;
            auVar65._16_4_ = fVar246 * fVar196;
            auVar65._20_4_ = fVar247 * fVar199;
            auVar65._24_4_ = fVar248 * fVar202;
            auVar65._28_4_ = local_2480._28_4_;
            auVar32 = vsubps_avx(auVar63,auVar64);
            auVar33 = vsubps_avx(auVar65,auVar62);
            auVar123 = vandps_avx(auVar64,auVar222);
            auVar30 = vandps_avx(auVar62,auVar222);
            auVar123 = vcmpps_avx(auVar123,auVar30,1);
            local_2720 = vblendvps_avx(auVar33,auVar32,auVar123);
            auVar86 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
            fVar188 = local_2720._0_4_;
            fVar191 = local_2720._4_4_;
            fVar194 = local_2720._8_4_;
            fVar85 = local_2720._12_4_;
            fVar90 = local_2720._16_4_;
            fVar91 = local_2720._20_4_;
            fVar92 = local_2720._24_4_;
            fVar197 = local_2740._0_4_;
            fVar200 = local_2740._4_4_;
            fVar203 = local_2740._8_4_;
            fVar208 = local_2740._12_4_;
            fVar209 = local_2740._16_4_;
            fVar210 = local_2740._20_4_;
            fVar211 = local_2740._24_4_;
            fVar93 = local_2760._0_4_;
            fVar94 = local_2760._4_4_;
            fVar95 = local_2760._8_4_;
            fVar153 = local_2760._12_4_;
            fVar155 = local_2760._16_4_;
            fVar157 = local_2760._20_4_;
            fVar159 = local_2760._24_4_;
            fVar96 = fVar93 * local_2920._4_4_ + fVar197 * local_28a0._4_4_ + fVar188 * fVar140;
            fVar204 = fVar94 * local_2920._4_4_ + fVar200 * local_28a0._4_4_ + fVar191 * fVar140;
            fVar149 = fVar95 * local_2920._4_4_ + fVar203 * local_28a0._4_4_ + fVar194 * fVar140;
            fVar106 = fVar153 * local_2920._4_4_ + fVar208 * local_28a0._4_4_ + fVar85 * fVar140;
            fVar107 = fVar155 * local_2920._4_4_ + fVar209 * local_28a0._4_4_ + fVar90 * fVar140;
            fVar174 = fVar157 * local_2920._4_4_ + fVar210 * local_28a0._4_4_ + fVar91 * fVar140;
            fVar140 = fVar159 * local_2920._4_4_ + fVar211 * local_28a0._4_4_ + fVar92 * fVar140;
            fVar185 = auVar123._28_4_ + auVar123._28_4_ + auVar26._28_4_;
            auVar101._0_4_ = fVar96 + fVar96;
            auVar101._4_4_ = fVar204 + fVar204;
            auVar101._8_4_ = fVar149 + fVar149;
            auVar101._12_4_ = fVar106 + fVar106;
            auVar101._16_4_ = fVar107 + fVar107;
            auVar101._20_4_ = fVar174 + fVar174;
            auVar101._24_4_ = fVar140 + fVar140;
            auVar101._28_4_ = fVar185 + fVar185;
            auVar123 = vrcpps_avx(auVar101);
            fVar96 = fVar93 * fVar29 + fVar197 * fVar27 + fVar188 * fVar28;
            fVar204 = fVar94 * fVar15 + fVar200 * fVar13 + fVar191 * fVar14;
            fVar112 = fVar95 * fVar114 + fVar203 * fVar112 + fVar194 * fVar113;
            fVar113 = fVar153 * fVar16 + fVar208 * fVar115 + fVar85 * fVar116;
            fVar114 = fVar155 * fVar19 + fVar209 * fVar17 + fVar90 * fVar18;
            fVar115 = fVar157 * fVar22 + fVar210 * fVar20 + fVar91 * fVar21;
            fVar116 = fVar159 * fVar25 + fVar211 * fVar23 + fVar92 * fVar24;
            fVar140 = auVar123._0_4_;
            fVar27 = auVar123._4_4_;
            auVar66._4_4_ = auVar101._4_4_ * fVar27;
            auVar66._0_4_ = auVar101._0_4_ * fVar140;
            fVar28 = auVar123._8_4_;
            auVar66._8_4_ = auVar101._8_4_ * fVar28;
            fVar29 = auVar123._12_4_;
            auVar66._12_4_ = auVar101._12_4_ * fVar29;
            fVar13 = auVar123._16_4_;
            auVar66._16_4_ = auVar101._16_4_ * fVar13;
            fVar14 = auVar123._20_4_;
            auVar66._20_4_ = auVar101._20_4_ * fVar14;
            fVar15 = auVar123._24_4_;
            auVar66._24_4_ = auVar101._24_4_ * fVar15;
            auVar66._28_4_ = auVar32._28_4_;
            auVar167._8_4_ = 0x3f800000;
            auVar167._0_8_ = 0x3f8000003f800000;
            auVar167._12_4_ = 0x3f800000;
            auVar167._16_4_ = 0x3f800000;
            auVar167._20_4_ = 0x3f800000;
            auVar167._24_4_ = 0x3f800000;
            auVar167._28_4_ = 0x3f800000;
            auVar123 = vsubps_avx(auVar167,auVar66);
            uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar139._4_4_ = uVar3;
            auVar139._0_4_ = uVar3;
            auVar139._8_4_ = uVar3;
            auVar139._12_4_ = uVar3;
            auVar139._16_4_ = uVar3;
            auVar139._20_4_ = uVar3;
            auVar139._24_4_ = uVar3;
            auVar139._28_4_ = uVar3;
            local_26a0._4_4_ = (fVar204 + fVar204) * (fVar27 + fVar27 * auVar123._4_4_);
            local_26a0._0_4_ = (fVar96 + fVar96) * (fVar140 + fVar140 * auVar123._0_4_);
            local_26a0._8_4_ = (fVar112 + fVar112) * (fVar28 + fVar28 * auVar123._8_4_);
            local_26a0._12_4_ = (fVar113 + fVar113) * (fVar29 + fVar29 * auVar123._12_4_);
            local_26a0._16_4_ = (fVar114 + fVar114) * (fVar13 + fVar13 * auVar123._16_4_);
            local_26a0._20_4_ = (fVar115 + fVar115) * (fVar14 + fVar14 * auVar123._20_4_);
            local_26a0._24_4_ = (fVar116 + fVar116) * (fVar15 + fVar15 * auVar123._24_4_);
            local_26a0._28_4_ = fVar151;
            auVar89 = ZEXT3264(local_26a0);
            auVar123 = vcmpps_avx(auVar139,local_26a0,2);
            fVar140 = (ray->super_RayK<1>).tfar;
            auVar127._4_4_ = fVar140;
            auVar127._0_4_ = fVar140;
            auVar127._8_4_ = fVar140;
            auVar127._12_4_ = fVar140;
            auVar127._16_4_ = fVar140;
            auVar127._20_4_ = fVar140;
            auVar127._24_4_ = fVar140;
            auVar127._28_4_ = fVar140;
            auVar26 = vcmpps_avx(local_26a0,auVar127,2);
            auVar123 = vandps_avx(auVar26,auVar123);
            auVar30 = vcmpps_avx(auVar101,_DAT_01f7b000,4);
            auVar123 = vandps_avx(auVar123,auVar30);
            auVar122 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
            auVar86 = vpand_avx(auVar122,auVar86);
            auVar122 = vpmovsxwd_avx(auVar86);
            auVar108 = vpshufd_avx(auVar86,0xee);
            auVar108 = vpmovsxwd_avx(auVar108);
            local_2700._16_16_ = auVar108;
            local_2700._0_16_ = auVar122;
            if ((((((((local_2700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_2700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2700 >> 0x7f,0) != '\0') ||
                  (local_2700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar108 >> 0x3f,0) != '\0') ||
                (local_2700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar108[0xf] < '\0') {
              local_27c0 = local_24c0;
              local_27a0 = local_24e0._0_4_;
              fStack_279c = local_24e0._4_4_;
              fStack_2798 = local_24e0._8_4_;
              fStack_2794 = local_24e0._12_4_;
              fStack_2790 = local_24e0._16_4_;
              fStack_278c = local_24e0._20_4_;
              fStack_2788 = local_24e0._24_4_;
              fStack_2784 = local_24e0._28_4_;
              auVar123 = vrcpps_avx(local_2520);
              local_2780 = local_2520;
              fVar140 = auVar123._0_4_;
              fVar27 = auVar123._4_4_;
              auVar67._4_4_ = local_2520._4_4_ * fVar27;
              auVar67._0_4_ = local_2520._0_4_ * fVar140;
              fVar28 = auVar123._8_4_;
              auVar67._8_4_ = local_2520._8_4_ * fVar28;
              fVar29 = auVar123._12_4_;
              auVar67._12_4_ = local_2520._12_4_ * fVar29;
              fVar13 = auVar123._16_4_;
              auVar67._16_4_ = local_2520._16_4_ * fVar13;
              fVar14 = auVar123._20_4_;
              auVar67._20_4_ = local_2520._20_4_ * fVar14;
              fVar15 = auVar123._24_4_;
              auVar67._24_4_ = local_2520._24_4_ * fVar15;
              auVar67._28_4_ = auVar26._28_4_;
              auVar173._8_4_ = 0x3f800000;
              auVar173._0_8_ = 0x3f8000003f800000;
              auVar173._12_4_ = 0x3f800000;
              auVar173._16_4_ = 0x3f800000;
              auVar173._20_4_ = 0x3f800000;
              auVar173._24_4_ = 0x3f800000;
              auVar173._28_4_ = 0x3f800000;
              auVar26 = vsubps_avx(auVar173,auVar67);
              auVar102._0_4_ = fVar140 + fVar140 * auVar26._0_4_;
              auVar102._4_4_ = fVar27 + fVar27 * auVar26._4_4_;
              auVar102._8_4_ = fVar28 + fVar28 * auVar26._8_4_;
              auVar102._12_4_ = fVar29 + fVar29 * auVar26._12_4_;
              auVar102._16_4_ = fVar13 + fVar13 * auVar26._16_4_;
              auVar102._20_4_ = fVar14 + fVar14 * auVar26._20_4_;
              auVar102._24_4_ = fVar15 + fVar15 * auVar26._24_4_;
              auVar102._28_4_ = auVar123._28_4_ + auVar26._28_4_;
              auVar128._8_4_ = 0x219392ef;
              auVar128._0_8_ = 0x219392ef219392ef;
              auVar128._12_4_ = 0x219392ef;
              auVar128._16_4_ = 0x219392ef;
              auVar128._20_4_ = 0x219392ef;
              auVar128._24_4_ = 0x219392ef;
              auVar128._28_4_ = 0x219392ef;
              auVar26 = vcmpps_avx(local_2500,auVar128,5);
              auVar123 = vandps_avx(auVar26,auVar102);
              local_2620._8_8_ = uStack_25f8;
              local_2620._0_8_ = local_2600;
              local_2620._16_8_ = uStack_25f0;
              local_2620._24_8_ = uStack_25e8;
              auVar68._4_4_ = local_24c0._4_4_ * auVar123._4_4_;
              auVar68._0_4_ = local_24c0._0_4_ * auVar123._0_4_;
              auVar68._8_4_ = local_24c0._8_4_ * auVar123._8_4_;
              auVar68._12_4_ = local_24c0._12_4_ * auVar123._12_4_;
              auVar68._16_4_ = local_24c0._16_4_ * auVar123._16_4_;
              auVar68._20_4_ = local_24c0._20_4_ * auVar123._20_4_;
              auVar68._24_4_ = local_24c0._24_4_ * auVar123._24_4_;
              auVar68._28_4_ = auVar26._28_4_;
              auVar26 = vminps_avx(auVar68,auVar173);
              auVar69._4_4_ = local_24e0._4_4_ * auVar123._4_4_;
              auVar69._0_4_ = local_24e0._0_4_ * auVar123._0_4_;
              auVar69._8_4_ = local_24e0._8_4_ * auVar123._8_4_;
              auVar69._12_4_ = local_24e0._12_4_ * auVar123._12_4_;
              auVar69._16_4_ = local_24e0._16_4_ * auVar123._16_4_;
              auVar69._20_4_ = local_24e0._20_4_ * auVar123._20_4_;
              auVar69._24_4_ = local_24e0._24_4_ * auVar123._24_4_;
              auVar69._28_4_ = auVar123._28_4_;
              auVar123 = vminps_avx(auVar69,auVar173);
              auVar30 = vsubps_avx(auVar173,auVar26);
              local_26c0 = vblendvps_avx(auVar123,auVar30,local_2620);
              auVar123 = vsubps_avx(auVar173,auVar123);
              local_26e0 = vblendvps_avx(auVar26,auVar123,local_2620);
              auVar103._8_4_ = 0xbf800000;
              auVar103._0_8_ = 0xbf800000bf800000;
              auVar103._12_4_ = 0xbf800000;
              auVar103._16_4_ = 0xbf800000;
              auVar103._20_4_ = 0xbf800000;
              auVar103._24_4_ = 0xbf800000;
              auVar103._28_4_ = 0xbf800000;
              auVar123 = vblendvps_avx(auVar173,auVar103,local_2620);
              fVar140 = auVar123._0_4_;
              fVar27 = auVar123._4_4_;
              fVar28 = auVar123._8_4_;
              fVar29 = auVar123._12_4_;
              fVar13 = auVar123._16_4_;
              fVar14 = auVar123._20_4_;
              fVar15 = auVar123._24_4_;
              local_2680[0] = fVar93 * fVar140;
              local_2680[1] = fVar94 * fVar27;
              local_2680[2] = fVar95 * fVar28;
              local_2680[3] = fVar153 * fVar29;
              fStack_2670 = fVar155 * fVar13;
              fStack_266c = fVar157 * fVar14;
              fStack_2668 = fVar159 * fVar15;
              uStack_2664 = auVar26._28_4_;
              local_2660[0] = fVar197 * fVar140;
              local_2660[1] = fVar200 * fVar27;
              local_2660[2] = fVar203 * fVar28;
              local_2660[3] = fVar208 * fVar29;
              fStack_2650 = fVar209 * fVar13;
              fStack_264c = fVar210 * fVar14;
              fStack_2648 = fVar211 * fVar15;
              uStack_2644 = local_26c0._28_4_;
              local_2640[0] = fVar140 * fVar188;
              local_2640[1] = fVar27 * fVar191;
              local_2640[2] = fVar28 * fVar194;
              local_2640[3] = fVar29 * fVar85;
              fStack_2630 = fVar13 * fVar90;
              fStack_262c = fVar14 * fVar91;
              fStack_2628 = fVar15 * fVar92;
              uStack_2624 = auVar123._28_4_;
              auVar122 = vpmovzxwd_avx(auVar86);
              auVar104._0_16_ = vpslld_avx(auVar122,0x1f);
              auVar122 = vpunpckhwd_avx(auVar86,auVar86);
              auVar122 = vpslld_avx(auVar122,0x1f);
              auVar104._16_16_ = auVar122;
              auVar129._8_4_ = 0x7f800000;
              auVar129._0_8_ = 0x7f8000007f800000;
              auVar129._12_4_ = 0x7f800000;
              auVar129._16_4_ = 0x7f800000;
              auVar129._20_4_ = 0x7f800000;
              auVar129._24_4_ = 0x7f800000;
              auVar129._28_4_ = 0x7f800000;
              auVar123 = vblendvps_avx(auVar129,local_26a0,auVar104);
              auVar26 = vshufps_avx(auVar123,auVar123,0xb1);
              auVar26 = vminps_avx(auVar123,auVar26);
              auVar30 = vshufpd_avx(auVar26,auVar26,5);
              auVar26 = vminps_avx(auVar26,auVar30);
              auVar30 = vperm2f128_avx(auVar26,auVar26,1);
              auVar26 = vminps_avx(auVar26,auVar30);
              auVar123 = vcmpps_avx(auVar123,auVar26,0);
              auVar122 = vpackssdw_avx(auVar123._0_16_,auVar123._16_16_);
              auVar86 = vpand_avx(auVar122,auVar86);
              auVar122 = vpmovzxwd_avx(auVar86);
              auVar122 = vpslld_avx(auVar122,0x1f);
              auVar122 = vpsrad_avx(auVar122,0x1f);
              auVar86 = vpunpckhwd_avx(auVar86,auVar86);
              auVar86 = vpslld_avx(auVar86,0x1f);
              auVar86 = vpsrad_avx(auVar86,0x1f);
              auVar87._16_16_ = auVar86;
              auVar87._0_16_ = auVar122;
              auVar123 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar215 = ZEXT3264(auVar123);
              local_2840 = local_2700;
              if ((((((((auVar87 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar87 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar87 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar87 >> 0x7f,0) == '\0') &&
                    (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB161(auVar86 >> 0x3f,0) == '\0') &&
                  (auVar87 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar86[0xf]) {
                auVar87 = local_2700;
              }
              uVar70 = vextractps_avx(auVar123._0_16_,1);
              uVar75 = vmovmskps_avx(auVar87);
              uVar76 = 0;
              local_2480 = auVar31;
              if (uVar75 != 0) {
                for (; (uVar75 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
                }
              }
LAB_00e773f3:
              uVar83 = CONCAT44(0,uVar76);
              local_2858 = *(uint *)((long)&local_23c0 + uVar83 * 4);
              pGVar12 = (pSVar6->geometries).items[local_2858].ptr;
              if ((pGVar12->mask & uVar70) == 0) {
                *(undefined4 *)(local_2840 + uVar83 * 4) = 0;
              }
              else {
                local_28a0 = (byte *)context->args;
                local_2820 = auVar215._0_32_;
                if (context->args->filter == (RTCFilterFunctionN)0x0) {
                  local_28f0.context = context->user;
                  if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar140 = *(float *)(local_26e0 + uVar83 * 4);
                    fVar27 = *(float *)(local_26c0 + uVar83 * 4);
                    (ray->super_RayK<1>).tfar = local_2680[uVar83 - 8];
                    (ray->Ng).field_0.field_0.x = local_2680[uVar83];
                    (ray->Ng).field_0.field_0.y = local_2660[uVar83];
                    (ray->Ng).field_0.field_0.z = local_2640[uVar83];
                    ray->u = fVar140;
                    ray->v = fVar27;
                    ray->primID = *(uint *)((long)&local_27e0 + uVar83 * 4);
                    ray->geomID = local_2858;
                    ray->instID[0] = (local_28f0.context)->instID[0];
                    ray->instPrimID[0] = (local_28f0.context)->instPrimID[0];
                    goto LAB_00e77771;
                  }
                }
                else {
                  local_28f0.context = context->user;
                }
                local_2870 = local_2680[uVar83];
                local_286c = local_2660[uVar83];
                local_2868 = local_2640[uVar83];
                local_2864 = *(undefined4 *)(local_26e0 + uVar83 * 4);
                local_2860 = *(undefined4 *)(local_26c0 + uVar83 * 4);
                local_285c = *(undefined4 *)((long)&local_27e0 + uVar83 * 4);
                local_2854 = (local_28f0.context)->instID[0];
                local_2850 = (local_28f0.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_2680[uVar83 - 8];
                local_2924 = -1;
                local_28f0.valid = &local_2924;
                local_28f0.geometryUserPtr = pGVar12->userPtr;
                local_28f0.ray = (RTCRayN *)ray;
                local_28f0.hit = (RTCHitN *)&local_2870;
                local_28f0.N = 1;
                local_2920 = (long)pGVar12;
                local_28c0 = auVar89._0_32_;
                local_2800._0_8_ = uVar83;
                if (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e775f6:
                  if ((*(code **)(local_28a0 + 0x10) != (code *)0x0) &&
                     (((*local_28a0 & 2) != 0 || ((*(byte *)(local_2920 + 0x3e) & 0x40) != 0)))) {
                    (**(code **)(local_28a0 + 0x10))(&local_28f0);
                    auVar89 = ZEXT3264(local_28c0);
                    uVar83 = local_2800._0_8_;
                    if (*local_28f0.valid == 0) goto LAB_00e776b8;
                  }
                  (((Vec3f *)((long)local_28f0.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_28f0.hit;
                  (((Vec3f *)((long)local_28f0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_28f0.hit + 4);
                  (((Vec3f *)((long)local_28f0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_28f0.hit + 8);
                  *(float *)((long)local_28f0.ray + 0x3c) = *(float *)(local_28f0.hit + 0xc);
                  *(float *)((long)local_28f0.ray + 0x40) = *(float *)(local_28f0.hit + 0x10);
                  *(float *)((long)local_28f0.ray + 0x44) = *(float *)(local_28f0.hit + 0x14);
                  *(float *)((long)local_28f0.ray + 0x48) = *(float *)(local_28f0.hit + 0x18);
                  *(float *)((long)local_28f0.ray + 0x4c) = *(float *)(local_28f0.hit + 0x1c);
                  *(float *)((long)local_28f0.ray + 0x50) = *(float *)(local_28f0.hit + 0x20);
                }
                else {
                  (*pGVar12->intersectionFilterN)(&local_28f0);
                  auVar89 = ZEXT3264(local_28c0);
                  uVar83 = local_2800._0_8_;
                  if (*local_28f0.valid != 0) goto LAB_00e775f6;
LAB_00e776b8:
                  (ray->super_RayK<1>).tfar = (float)local_2820._0_4_;
                  uVar83 = local_2800._0_8_;
                }
                *(undefined4 *)(local_2840 + uVar83 * 4) = 0;
                fVar140 = (ray->super_RayK<1>).tfar;
                auVar88._4_4_ = fVar140;
                auVar88._0_4_ = fVar140;
                auVar88._8_4_ = fVar140;
                auVar88._12_4_ = fVar140;
                auVar88._16_4_ = fVar140;
                auVar88._20_4_ = fVar140;
                auVar88._24_4_ = fVar140;
                auVar88._28_4_ = fVar140;
                auVar123 = vcmpps_avx(auVar89._0_32_,auVar88,2);
                local_2840 = vandps_avx(auVar123,local_2840);
                uVar70 = (ray->super_RayK<1>).mask;
                auVar215 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
              }
              if ((((((((local_2840 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2840 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2840 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2840 >> 0x7f,0) == '\0') &&
                    (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2840 >> 0xbf,0) == '\0') &&
                  (local_2840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2840[0x1f]) goto LAB_00e77771;
              auVar105._8_4_ = 0x7f800000;
              auVar105._0_8_ = 0x7f8000007f800000;
              auVar105._12_4_ = 0x7f800000;
              auVar105._16_4_ = 0x7f800000;
              auVar105._20_4_ = 0x7f800000;
              auVar105._24_4_ = 0x7f800000;
              auVar105._28_4_ = 0x7f800000;
              auVar123 = vblendvps_avx(auVar105,auVar89._0_32_,local_2840);
              auVar26 = vshufps_avx(auVar123,auVar123,0xb1);
              auVar26 = vminps_avx(auVar123,auVar26);
              auVar30 = vshufpd_avx(auVar26,auVar26,5);
              auVar26 = vminps_avx(auVar26,auVar30);
              auVar30 = vperm2f128_avx(auVar26,auVar26,1);
              auVar26 = vminps_avx(auVar26,auVar30);
              auVar26 = vcmpps_avx(auVar123,auVar26,0);
              auVar30 = local_2840 & auVar26;
              auVar123 = local_2840;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar123 = vandps_avx(auVar26,local_2840);
              }
              uVar75 = vmovmskps_avx(auVar123);
              uVar76 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> uVar76 & 1) == 0; uVar76 = uVar76 + 1) {
                }
              }
              goto LAB_00e773f3;
            }
          }
LAB_00e77771:
          auVar215 = ZEXT3264(local_2540);
          auVar217 = ZEXT3264(local_2560);
          auVar223 = ZEXT3264(local_2580);
          auVar237 = ZEXT3264(local_25a0);
          auVar239 = ZEXT3264(local_25c0);
          auVar242 = ZEXT3264(local_25e0);
        }
        fVar140 = (ray->super_RayK<1>).tfar;
        auVar89 = ZEXT3264(CONCAT428(fVar140,CONCAT424(fVar140,CONCAT420(fVar140,CONCAT416(fVar140,
                                                  CONCAT412(fVar140,CONCAT48(fVar140,CONCAT44(
                                                  fVar140,fVar140))))))));
      }
      goto LAB_00e76789;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }